

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  undefined1 auVar4 [16];
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_buf_t buf;
  uv_stdio_container_t stdio [3];
  undefined1 local_1e0 [8];
  uv_fs_t fs_req;
  uv_os_fd_t stderr_file;
  uv_os_fd_t stdout_file;
  int r;
  
  unlink("stdout_file");
  unlink("stderr_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open(0,local_1e0,"stdout_file",0x42,0x180);
  iVar2 = (int)fs_req.cb;
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x205,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  iVar2 = dup2(iVar2,1);
  if (iVar2 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x209,"stdout_file","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  iVar1 = uv_fs_open(0,local_1e0,"stderr_file",0x42,0x180);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x20e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  fs_req.bufsml[3].len._4_4_ = (int)fs_req.cb;
  uv_fs_req_cleanup(local_1e0);
  fs_req.bufsml[3].len._4_4_ = dup2(fs_req.bufsml[3].len._4_4_,2);
  if (fs_req.bufsml[3].len._4_4_ == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x212,"stderr_file","!=","-1",0xffffffffffffffff,"!=",0xffffffffffffffff);
    abort();
  }
  options.stdio = (uv_stdio_container_t *)&buf.len;
  buf.len._0_4_ = 0;
  options.stdio_count = 3;
  uVar3 = uv_default_loop();
  iVar1 = uv_spawn(uVar3,&process,&options);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x21f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_default_loop();
  iVar1 = uv_run(uVar3,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x222,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x224,"1","==","exit_cb_called",1,"==",(long)exit_cb_called);
    abort();
  }
  if ((long)close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x225,"1","==","close_cb_called",1,"==",(long)close_cb_called);
    abort();
  }
  auVar4 = uv_buf_init(output,0x400);
  buf.base = auVar4._8_8_;
  eval_a = auVar4._0_8_;
  iVar1 = uv_fs_read(0,local_1e0,iVar2,&eval_a,1,0,0);
  if ((long)iVar1 < 0xf) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x22b,"r",">=","15",(long)iVar1,">=",0xf);
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  iVar2 = uv_fs_close(0,local_1e0,iVar2);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x22f,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  printf("output is: %s",output);
  iVar2 = strncmp("hello errworld\n",output,0xf);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x233,"strncmp(\"hello errworld\\n\", output, 15)","==","0",(long)iVar2,"==",0);
    abort();
  }
  iVar2 = uv_fs_read(0,local_1e0,fs_req.bufsml[3].len._4_4_,&eval_a,1,0,0);
  if ((long)iVar2 < 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x237,"r",">=","12",(long)iVar2,">=",0xc);
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  iVar2 = uv_fs_close(0,local_1e0,fs_req.bufsml[3].len._4_4_);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x23b,"r","==","0",(long)iVar2,"==",0);
    abort();
  }
  uv_fs_req_cleanup(local_1e0);
  printf("output is: %s",output);
  iVar2 = strncmp("hello world\n",output,0xc);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x23f,"strncmp(\"hello world\\n\", output, 12)","==","0",(long)iVar2,"==",0);
    abort();
  }
  unlink("stdout_file");
  unlink("stderr_file");
  loop = (uv_loop_t *)uv_default_loop();
  close_loop(loop);
  uVar3 = uv_default_loop();
  iVar2 = uv_loop_close(uVar3);
  if ((long)iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x245,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar2);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_os_fd_t stdout_file;
  uv_os_fd_t stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT_OK(r);
  stdout_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(stdout_file, STDOUT_FILENO);
  ASSERT_NE(stdout_file, -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  stderr_file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(stderr_file, STDERR_FILENO);
  ASSERT_NE(stderr_file, -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.file = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello errworld\n", output, 15));

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT_GE(r, 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strncmp("hello world\n", output, 12));

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}